

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potpourri.cpp
# Opt level: O2

int main(void)

{
  A *pAVar1;
  pointer puVar2;
  pointer pfVar3;
  pointer pbVar4;
  ostream *poVar5;
  invalid_argument *this;
  code *pcVar6;
  unique_ptr<A,_std::default_delete<A>_> *ap;
  pointer puVar7;
  pointer ppAVar8;
  pointer pbVar9;
  undefined *puVar10;
  pointer __x;
  unique_ptr<A,_std::default_delete<A>_> *ap_1;
  initializer_list<A_*> __l;
  Adder<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> baz;
  string greet;
  vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
  vua;
  string john;
  _Head_base<0UL,_A_*,_false> local_170;
  vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
  fv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sv;
  shared_ptr<A> local_130;
  vector<A_*,_std::allocator<A_*>_> vpa;
  string s;
  Vec<float,_4UL> local_e8;
  Vec<float,_3UL> local_d8;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
  f;
  Vec<float,_4UL> h;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)&std::cin,(string *)&s);
  if (s._M_string_length < 0xb) {
    if (4 < s._M_string_length) {
      poVar5 = std::operator<<((ostream *)&std::cout,(string *)&s);
      std::operator<<(poVar5,'\n');
      local_d8.data[0] = 0.1;
      local_d8.data[1] = 0.2;
      local_d8.data[2] = 0.3;
      local_e8.data[0] = 0.1;
      local_e8.data[1] = 0.2;
      local_e8.data[2] = 0.3;
      Vec<float,3ul>::operator*(&local_d8,(Vec<float,_3UL> *)&local_e8);
      Vec<float,3ul>::operator+((Vec<float,_3UL> *)&baz,&local_d8);
      poVar5 = operator<<((ostream *)&std::cout,(Vec<float,_3UL> *)&greet);
      std::operator<<(poVar5,'\n');
      Vec<float,3ul>::operator+((Vec<float,3ul> *)&greet,&local_e8);
      poVar5 = operator<<((ostream *)&std::cout,(Vec<float,_4UL> *)&greet);
      std::operator<<(poVar5,'\n');
      vua.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vua.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vua.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      john._M_dataplus._M_p._0_4_ = 3;
      std::make_unique<B,int>((int *)&baz);
      greet._M_dataplus = baz.y._M_dataplus;
      baz.y._M_dataplus._M_p = (pointer)0x0;
      std::
      vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
      ::emplace_back<std::unique_ptr<A,std::default_delete<A>>>
                ((vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
                  *)&vua,(unique_ptr<A,_std::default_delete<A>_> *)&greet);
      std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
                ((unique_ptr<A,_std::default_delete<A>_> *)&greet);
      std::unique_ptr<B,_std::default_delete<B>_>::~unique_ptr
                ((unique_ptr<B,_std::default_delete<B>_> *)&baz);
      john._M_dataplus._M_p._0_4_ = 4;
      std::make_unique<B,int>((int *)&baz);
      greet._M_dataplus = baz.y._M_dataplus;
      baz.y._M_dataplus._M_p = (pointer)0x0;
      std::
      vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
      ::emplace_back<std::unique_ptr<A,std::default_delete<A>>>
                ((vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
                  *)&vua,(unique_ptr<A,_std::default_delete<A>_> *)&greet);
      std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
                ((unique_ptr<A,_std::default_delete<A>_> *)&greet);
      std::unique_ptr<B,_std::default_delete<B>_>::~unique_ptr
                ((unique_ptr<B,_std::default_delete<B>_> *)&baz);
      greet._M_dataplus._M_p = (pointer)operator_new(0x10);
      baz.y._M_dataplus._M_p = (pointer)0x0;
      *(undefined ***)greet._M_dataplus._M_p = &PTR_foo_00106cc0;
      std::
      vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
      ::emplace_back<std::unique_ptr<A,std::default_delete<A>>>
                ((vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
                  *)&vua,(unique_ptr<A,_std::default_delete<A>_> *)&greet);
      std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
                ((unique_ptr<A,_std::default_delete<A>_> *)&greet);
      std::unique_ptr<C,_std::default_delete<C>_>::~unique_ptr
                ((unique_ptr<C,_std::default_delete<C>_> *)&baz);
      greet._M_dataplus._M_p = (pointer)operator_new(0x10);
      baz.y._M_dataplus._M_p = (pointer)0x0;
      *(undefined ***)greet._M_dataplus._M_p = &PTR_foo_00106cc0;
      std::
      vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
      ::emplace_back<std::unique_ptr<A,std::default_delete<A>>>
                ((vector<std::unique_ptr<A,std::default_delete<A>>,std::allocator<std::unique_ptr<A,std::default_delete<A>>>>
                  *)&vua,(unique_ptr<A,_std::default_delete<A>_> *)&greet);
      std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
                ((unique_ptr<A,_std::default_delete<A>_> *)&greet);
      std::unique_ptr<C,_std::default_delete<C>_>::~unique_ptr
                ((unique_ptr<C,_std::default_delete<C>_> *)&baz);
      greet._M_dataplus._M_p = (pointer)operator_new(0x10);
      *(undefined ***)greet._M_dataplus._M_p = &PTR_foo_00106c68;
      greet._M_dataplus._M_p[8] = '\x01';
      greet._M_dataplus._M_p[9] = '\0';
      greet._M_dataplus._M_p[10] = '\0';
      greet._M_dataplus._M_p[0xb] = '\0';
      greet._M_string_length = (size_type)operator_new(0x10);
      *(undefined ***)greet._M_string_length = &PTR_foo_00106c68;
      *(undefined4 *)(greet._M_string_length + 8) = 2;
      greet.field_2._M_allocated_capacity = (size_type)operator_new(0x10);
      *(undefined ***)greet.field_2._M_allocated_capacity = &PTR_foo_00106cc0;
      greet.field_2._8_8_ = operator_new(0x10);
      *(undefined ***)greet.field_2._8_8_ = &PTR_foo_00106cc0;
      __l._M_len = 4;
      __l._M_array = (iterator)&greet;
      std::vector<A_*,_std::allocator<A_*>_>::vector(&vpa,__l,(allocator_type *)&baz);
      puVar2 = vua.
               super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar7 = vua.
                    super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ppAVar8 = vpa.super__Vector_base<A_*,_std::allocator<A_*>_>._M_impl.
                    super__Vector_impl_data._M_start, puVar7 != puVar2; puVar7 = puVar7 + 1) {
        (**((puVar7->_M_t).super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
            super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.super__Head_base<0UL,_A_*,_false>.
           _M_head_impl)->_vptr_A)();
      }
      for (; ppAVar8 !=
             vpa.super__Vector_base<A_*,_std::allocator<A_*>_>._M_impl.super__Vector_impl_data.
             _M_finish; ppAVar8 = ppAVar8 + 1) {
        (**(*ppAVar8)->_vptr_A)();
      }
      local_170._M_head_impl =
           vua.
           super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
           super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
           super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.super__Head_base<0UL,_A_*,_false>.
           _M_head_impl;
      vua.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[1]._M_t.
      super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
      super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.super__Head_base<0UL,_A_*,_false>.
      _M_head_impl = (A *)0x0;
      takes_ownership((unique_ptr<A,_std::default_delete<A>_> *)&local_170);
      std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
                ((unique_ptr<A,_std::default_delete<A>_> *)&local_170);
      pAVar1 = vua.
               super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
               super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
               super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.
               super__Head_base<0UL,_A_*,_false>._M_head_impl;
      vua.
      super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[2]._M_t.
      super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
      super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.super__Head_base<0UL,_A_*,_false>.
      _M_head_impl = (A *)0x0;
      std::__shared_ptr<A,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<A,void>
                ((__shared_ptr<A,(__gnu_cxx::_Lock_policy)2> *)&local_130,pAVar1);
      shared_ownership(&local_130);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_130.super___shared_ptr<A,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      puVar2 = vua.
               super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar7 = vua.
                    super__Vector_base<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1
          ) {
        pAVar1 = (puVar7->_M_t).super___uniq_ptr_impl<A,_std::default_delete<A>_>._M_t.
                 super__Tuple_impl<0UL,_A_*,_std::default_delete<A>_>.
                 super__Head_base<0UL,_A_*,_false>._M_head_impl;
        if (pAVar1 == (A *)0x0) {
          std::operator<<((ostream *)&std::cout,"The ownership has moved away!\n");
        }
        else {
          (**pAVar1->_vptr_A)();
        }
      }
      std::__cxx11::string::string((string *)&greet,"Hello, ",(allocator *)&baz);
      std::__cxx11::string::string(local_90,"Bye, ",(allocator *)&john);
      std::__cxx11::string::string((string *)&baz,local_90);
      std::__cxx11::string::~string(local_90);
      fv.
      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      fv.
      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      fv.
      super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      john._M_string_length = 0;
      john.field_2._8_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/split-tutor[P]potpourri/potpourri.cpp:221:16)>
           ::_M_invoke;
      john.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/split-tutor[P]potpourri/potpourri.cpp:221:16)>
           ::_M_manager;
      john._M_dataplus._M_p = (pointer)&greet;
      std::
      vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
      ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string)>>
                ((vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
                  *)&fv,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                         *)&john);
      std::_Function_base::~_Function_base((_Function_base *)&john);
      john._M_string_length = 0;
      john._M_dataplus._M_p = (pointer)0x2a;
      john.field_2._8_8_ =
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/split-tutor[P]potpourri/potpourri.cpp:224:16)>
           ::_M_invoke;
      john.field_2._M_allocated_capacity =
           (size_type)
           std::
           _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/split-tutor[P]potpourri/potpourri.cpp:224:16)>
           ::_M_manager;
      std::
      vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
      ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string)>>
                ((vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
                  *)&fv,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                         *)&john);
      std::_Function_base::~_Function_base((_Function_base *)&john);
      std::function<std::__cxx11::string(std::__cxx11::string)>::
      function<Adder<std::__cxx11::string>&,void>
                ((function<std::__cxx11::string(std::__cxx11::string)> *)&john,&baz);
      std::
      vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
      ::emplace_back<std::function<std::__cxx11::string(std::__cxx11::string)>>
                ((vector<std::function<std::__cxx11::string(std::__cxx11::string)>,std::allocator<std::function<std::__cxx11::string(std::__cxx11::string)>>>
                  *)&fv,(function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                         *)&john);
      std::_Function_base::~_Function_base((_Function_base *)&john);
      std::__cxx11::string::string((string *)&john,"John Doe",(allocator *)&f);
      pfVar3 = fv.
               super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sv.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      sv.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      sv.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (__x = fv.
                 super__Vector_base<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          pbVar4 = sv.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish, __x != pfVar3; __x = __x + 1) {
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::function(&f,__x);
        std::__cxx11::string::string((string *)&local_70,(string *)&john);
        std::
        function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::operator()(&local_50,&f,&local_70);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&sv,
                   &local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator<<((ostream *)&std::cout,"a\n");
        std::_Function_base::~_Function_base(&f.super__Function_base);
      }
      for (pbVar9 = sv.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar4; pbVar9 = pbVar9 + 1
          ) {
        std::__cxx11::string::string((string *)&f,(string *)pbVar9);
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)&f);
        std::operator<<(poVar5,'\n');
        std::__cxx11::string::~string((string *)&f);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&sv);
      std::__cxx11::string::~string((string *)&john);
      std::
      vector<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>,_std::allocator<std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>_>_>
      ::~vector(&fv);
      std::__cxx11::string::~string((string *)&baz);
      std::__cxx11::string::~string((string *)&greet);
      std::_Vector_base<A_*,_std::allocator<A_*>_>::~_Vector_base
                (&vpa.super__Vector_base<A_*,_std::allocator<A_*>_>);
      std::
      vector<std::unique_ptr<A,_std::default_delete<A>_>,_std::allocator<std::unique_ptr<A,_std::default_delete<A>_>_>_>
      ::~vector(&vua);
      std::__cxx11::string::~string((string *)&s);
      return 0;
    }
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"invalid argument");
    pcVar6 = std::invalid_argument::~invalid_argument;
    puVar10 = &std::invalid_argument::typeinfo;
  }
  else {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range((out_of_range *)this,"Out of range");
    pcVar6 = std::out_of_range::~out_of_range;
    puVar10 = &std::out_of_range::typeinfo;
  }
  __cxa_throw(this,puVar10,pcVar6);
}

Assistant:

int main()
{
    /**
     * 1. try-block for exception handling
     */
    std::string s;
    std::cin >> s;

    try {
        if (s.length() > 10) {
            throw std::out_of_range("Out of range");
        } else if (s.length() < 5) {
            throw std::invalid_argument("invalid argument");
        } else {
            std::cout << s << '\n';
        }
    } catch (const std::out_of_range& e) {
        std::cout << e.what() << '\n';
    } catch (const std::invalid_argument& e) {
        std::cout << e.what() << '\n';
    }

    /**
     * 2. Constant template
     */
    Vec<float, 3> f{0.1, 0.2, 0.3};
    Vec<float, 3> g{0.1, 0.2, 0.3};
    Vec<float, 4> h{0.1, 0.2, 0.3, 0.5};

    std::cout << (f * g) + f << '\n';

    try {
        // Vector size mismatch
        auto m = g + h;
        
        // Never reached
        std::cout << m << '\n';
    } catch (const std::exception& e) {
        std::cout << e.what() << '\n';
    }

    // unique_ptr for strict ownership management
    std::vector<std::unique_ptr<A>> vua;
    vua.push_back(std::make_unique<B>(3));
    vua.push_back(std::make_unique<B>(4));
    vua.push_back(std::make_unique<C>(5));
    vua.push_back(std::make_unique<C>(6));

    std::vector<A*> vpa = {
        new B(1),
        new B(2),
        new C(7),
        new C(8)
    };

    for (auto&& ap : vua) {
        ap->foo();
    }

    for (auto ap : vpa) {
        ap->foo();
    }

    // The ownership is passed to the function. Note `std::move()` used here
    takes_ownership(std::move(vua[1]));
    // `unique_ptr` can also be shared over multiple functions.
    // Note that `.release()` is called to release a shared_ptr from the `unique_ptr`.
    shared_ownership(std::shared_ptr<A>(vua[2].release()));

    for (auto&& ap : vua) {
        if (!ap) {
            std::cout << "The ownership has moved away!\n";
        } else {
            ap->foo();
        }
    }
    
    /**
     * 4. Lambda
     */
    std::string greet = "Hello, ";
    int secret = 42;

    // Captures the _reference_  of `greet`
    auto foo = [&greet](std::string name){ return greet + name; };

    // Capatures the _value_ of `secret`
    auto bar = [secret](std::string name){
        std::ostringstream oss;

        oss << name << "got the secret (" << secret << ')';

        return oss.str();
    };

    auto baz = Adder<std::string>{"Bye, "};

    std::vector<std::function<std::string(std::string)>> fv;
    fv.push_back(foo);
    fv.push_back(bar);

    // A function class is also considered as a function type
    fv.push_back(baz);

    std::string john = "John Doe";
    std::vector<std::string> sv;
    for (auto f : fv) {
        sv.push_back(f(john));
        std::cout << "a\n";
    }

    for (auto s : sv) {
        std::cout << s << '\n';
    }
}